

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

void aom_img_truncate_16_to_8(aom_image_t *dst,aom_image_t *src)

{
  aom_img_fmt_t aVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  aVar1 = dst->fmt;
  if ((((aVar1 + 0x800 == src->fmt) && (dst->d_w == src->d_w)) && (dst->d_h == src->d_h)) &&
     (((dst->x_chroma_shift == src->x_chroma_shift && (dst->y_chroma_shift == src->y_chroma_shift))
      && ((aVar1 - AOM_IMG_FMT_I422 < 2 || (aVar1 == AOM_IMG_FMT_I420)))))) {
    lVar7 = 0;
    do {
      uVar9 = src->d_w;
      uVar10 = src->d_h;
      if (lVar7 != 0) {
        uVar9 = uVar9 + src->x_chroma_shift >> ((byte)src->x_chroma_shift & 0x1f);
        uVar10 = uVar10 + src->y_chroma_shift >> ((byte)src->y_chroma_shift & 0x1f);
      }
      if (0 < (int)uVar10) {
        uVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            iVar2 = dst->stride[lVar7];
            puVar4 = dst->planes[lVar7];
            iVar3 = src->stride[lVar7];
            puVar5 = src->planes[lVar7];
            lVar8 = 0;
            do {
              puVar4[lVar8 + (int)(iVar2 * uVar6)] = puVar5[lVar8 * 2 + (long)(int)(iVar3 * uVar6)];
              lVar8 = lVar8 + 1;
            } while (uVar9 != (uint)lVar8);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar10);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    return;
  }
  fatal("Unsupported image conversion");
}

Assistant:

void aom_img_truncate_16_to_8(aom_image_t *dst, const aom_image_t *src) {
  int plane;
  if (dst->fmt + AOM_IMG_FMT_HIGHBITDEPTH != src->fmt || dst->d_w != src->d_w ||
      dst->d_h != src->d_h || dst->x_chroma_shift != src->x_chroma_shift ||
      dst->y_chroma_shift != src->y_chroma_shift) {
    fatal("Unsupported image conversion");
  }
  switch (dst->fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I444: break;
    default: fatal("Unsupported image conversion");
  }
  for (plane = 0; plane < 3; plane++) {
    int w = src->d_w;
    int h = src->d_h;
    int x, y;
    if (plane) {
      w = (w + src->x_chroma_shift) >> src->x_chroma_shift;
      h = (h + src->y_chroma_shift) >> src->y_chroma_shift;
    }
    for (y = 0; y < h; y++) {
      const uint16_t *p_src =
          (const uint16_t *)(src->planes[plane] + y * src->stride[plane]);
      uint8_t *p_dst = dst->planes[plane] + y * dst->stride[plane];
      for (x = 0; x < w; x++) {
        *p_dst++ = (uint8_t)(*p_src++);
      }
    }
  }
}